

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int fl_wait(double time_to_wait)

{
  int iVar1;
  ushort local_1ba;
  int iStack_1b4;
  short revents;
  int f;
  int i;
  timeval t;
  undefined1 local_198 [4];
  int n;
  fd_set fdt [3];
  double time_to_wait_local;
  
  fdt[2].fds_bits[0xf] = (__fd_mask)time_to_wait;
  if ((fl_display == (Display *)0x0) || (iVar1 = XQLength(fl_display), iVar1 == 0)) {
    memcpy(local_198,fdsets,0x80);
    memcpy(fdt[0].fds_bits + 0xf,fdsets + 1,0x80);
    memcpy(fdt[1].fds_bits + 0xf,fdsets + 2,0x80);
    (*fl_unlock_function)();
    if (2147483.648 <= (double)fdt[2].fds_bits[0xf]) {
      t.tv_usec._4_4_ =
           select(maxfd + 1,(fd_set *)local_198,(fd_set *)(fdt[0].fds_bits + 0xf),
                  (fd_set *)(fdt[1].fds_bits + 0xf),(timeval *)0x0);
    }
    else {
      _f = (long)(int)(double)fdt[2].fds_bits[0xf];
      t.tv_sec = (__time_t)(int)(((double)fdt[2].fds_bits[0xf] - (double)_f) * 1000000.0);
      t.tv_usec._4_4_ =
           select(maxfd + 1,(fd_set *)local_198,(fd_set *)(fdt[0].fds_bits + 0xf),
                  (fd_set *)(fdt[1].fds_bits + 0xf),(timeval *)&f);
    }
    (*fl_lock_function)();
    if (0 < t.tv_usec._4_4_) {
      for (iStack_1b4 = 0; iStack_1b4 < nfds; iStack_1b4 = iStack_1b4 + 1) {
        iVar1 = fd[iStack_1b4].fd;
        local_1ba = (ushort)((*(ulong *)(local_198 + (long)(iVar1 / 0x40) * 8) &
                             1L << ((byte)((long)iVar1 % 0x40) & 0x3f)) != 0);
        if ((fdt[0].fds_bits[(long)(iVar1 / 0x40) + 0xf] & 1L << ((byte)((long)iVar1 % 0x40) & 0x3f)
            ) != 0) {
          local_1ba = local_1ba | 4;
        }
        if ((fdt[1].fds_bits[(long)(iVar1 / 0x40) + 0xf] & 1L << ((byte)((long)iVar1 % 0x40) & 0x3f)
            ) != 0) {
          local_1ba = local_1ba | 8;
        }
        if ((fd[iStack_1b4].events & local_1ba) != 0) {
          (*fd[iStack_1b4].cb)(iVar1,fd[iStack_1b4].arg);
        }
      }
    }
    time_to_wait_local._4_4_ = t.tv_usec._4_4_;
  }
  else {
    do_queued_events();
    time_to_wait_local._4_4_ = 1;
  }
  return time_to_wait_local._4_4_;
}

Assistant:

int fl_wait(double time_to_wait) {

  // OpenGL and other broken libraries call XEventsQueued
  // unnecessarily and thus cause the file descriptor to not be ready,
  // so we must check for already-read events:
  if (fl_display && XQLength(fl_display)) {do_queued_events(); return 1;}

#  if !USE_POLL
  fd_set fdt[3];
  fdt[0] = fdsets[0];
  fdt[1] = fdsets[1];
  fdt[2] = fdsets[2];
#  endif
  int n;

  fl_unlock_function();

  if (time_to_wait < 2147483.648) {
#  if USE_POLL
    n = ::poll(pollfds, nfds, int(time_to_wait*1000 + .5));
#  else
    timeval t;
    t.tv_sec = int(time_to_wait);
    t.tv_usec = int(1000000 * (time_to_wait-t.tv_sec));
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],&t);
#  endif
  } else {
#  if USE_POLL
    n = ::poll(pollfds, nfds, -1);
#  else
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],0);
#  endif
  }

  fl_lock_function();

  if (n > 0) {
    for (int i=0; i<nfds; i++) {
#  if USE_POLL
      if (pollfds[i].revents) fd[i].cb(pollfds[i].fd, fd[i].arg);
#  else
      int f = fd[i].fd;
      short revents = 0;
      if (FD_ISSET(f,&fdt[0])) revents |= POLLIN;
      if (FD_ISSET(f,&fdt[1])) revents |= POLLOUT;
      if (FD_ISSET(f,&fdt[2])) revents |= POLLERR;
      if (fd[i].events & revents) fd[i].cb(f, fd[i].arg);
#  endif
    }
  }
  return n;
}